

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsFederate helicsFederateClone(HelicsFederate fed,HelicsError *err)

{
  FederateType in_stack_0000000c;
  shared_ptr<helics::Federate> *in_stack_00000010;
  FedObject *fedObj;
  shared_ptr<helics::Federate> *in_stack_ffffffffffffffa8;
  HelicsError *in_stack_ffffffffffffffb0;
  HelicsFederate in_stack_ffffffffffffffb8;
  shared_ptr<helics::Federate> local_30;
  FedObject *local_20;
  HelicsFederate local_8;
  
  local_20 = helics::getFedObject(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (local_20 == (FedObject *)0x0) {
    local_8 = (HelicsFederate)0x0;
  }
  else {
    std::shared_ptr<helics::Federate>::shared_ptr(&local_30,in_stack_ffffffffffffffa8);
    local_8 = generateNewHelicsFederateObject(in_stack_00000010,in_stack_0000000c);
    std::shared_ptr<helics::Federate>::~shared_ptr((shared_ptr<helics::Federate> *)0x1babe9);
  }
  return local_8;
}

Assistant:

HelicsFederate helicsFederateClone(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    return generateNewHelicsFederateObject(fedObj->fedptr, fedObj->type);
}